

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

iterator * __thiscall
tcb::unicode::detail::
unicode_view<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_char16_t>
::iterator::operator++(iterator *this)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  code_point u;
  encoded_chars<char16_t> eVar4;
  char32_t c;
  iterator *this_local;
  
  bVar1 = this->idx_ + 1;
  this->idx_ = bVar1;
  uVar3 = encoded_chars<char16_t>::size(&this->next_chars_);
  if ((bVar1 == uVar3) && (bVar2 = __gnu_cxx::operator!=(&this->first_,&this->last_), bVar2)) {
    u = utf_traits<char,1>::
        decode<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  (&this->first_,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(this->last_)._M_current);
    eVar4 = utf_traits<char16_t,_2>::encode(u);
    this->next_chars_ = eVar4;
    this->idx_ = '\0';
  }
  return this;
}

Assistant:

TCB_CONSTEXPR14 iterator& operator++()
        {
            if (++idx_ == next_chars_.size() && first_ != last_) {
                char32_t c = utf_traits<InCharT>::decode(first_, last_);
                next_chars_ = utf_traits<OutCharT>::encode(c);
                idx_ = 0;
            }
            return *this;
        }